

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.cc
# Opt level: O3

void __thiscall Tiles::initoptab(Tiles *this)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  bool bVar6;
  
  piVar5 = this->optab[0].ops;
  uVar2 = 0;
  do {
    bVar6 = 3 < uVar2;
    uVar1 = (uint)uVar2;
    if (bVar6) {
      *piVar5 = uVar1 - 4;
    }
    uVar4 = (uint)bVar6;
    if ((uVar2 & 3) == 0) {
LAB_00101581:
      uVar3 = uVar4 + 1;
      ((anon_struct_20_2_fa2531a9 *)(piVar5 + -1))->n = uVar3;
      piVar5[uVar4] = uVar1 + 1;
    }
    else {
      uVar3 = bVar6 + 1;
      ((anon_struct_20_2_fa2531a9 *)(piVar5 + -1))->n = uVar3;
      piVar5[bVar6] = uVar1 - 1;
      uVar4 = uVar3;
      if ((uVar1 & 3) != 3) goto LAB_00101581;
    }
    if (uVar2 < 0xc) {
      ((anon_struct_20_2_fa2531a9 *)(piVar5 + -1))->n = uVar3 + 1;
      piVar5[uVar3] = uVar1 + 4;
      if (3 < uVar3) {
        __assert_fail("optab[i].n <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/tiles.cc"
                      ,0x54,"void Tiles::initoptab()");
      }
    }
    uVar2 = uVar2 + 1;
    piVar5 = piVar5 + 5;
    if (uVar2 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void Tiles::initoptab() {
	for (int i = 0; i < Ntiles; i++) {
		optab[i].n = 0;
		if (i >= Width)
			optab[i].ops[optab[i].n++] =  i - Width;
		if (i % Width > 0)
			optab[i].ops[optab[i].n++] =  i - 1;
		if (i % Width < Width - 1)
			optab[i].ops[optab[i].n++] =  i + 1;
		if (i < Ntiles - Width)
			optab[i].ops[optab[i].n++] =  i + Width;
		assert (optab[i].n <= 4);
	}
}